

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.h
# Opt level: O0

void JsUtil::QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
               (char *a,char *b,size_t size)

{
  char cVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  ulong uStack_60;
  char c_3;
  size_t i_3;
  ulong uStack_50;
  CC_QSORT_SWAP2 c_2;
  size_t i_2;
  ulong uStack_40;
  CC_QSORT_SWAP4 c_1;
  size_t i_1;
  CC_QSORT_SWAP8 c;
  size_t i;
  size_t mod;
  size_t size_local;
  char *b_local;
  char *a_local;
  
  if (a != b) {
    if (size < 8) {
      if (size < 4) {
        i = size & 1;
        for (uStack_50 = 0; uStack_50 < size >> 1; uStack_50 = uStack_50 + 1) {
          uVar2 = *(undefined2 *)(a + uStack_50 * 2);
          *(undefined2 *)(a + uStack_50 * 2) = *(undefined2 *)(b + uStack_50 * 2);
          *(undefined2 *)(b + uStack_50 * 2) = uVar2;
        }
      }
      else {
        i = size & 3;
        for (uStack_40 = 0; uStack_40 < size >> 2; uStack_40 = uStack_40 + 1) {
          uVar3 = *(undefined4 *)(a + uStack_40 * 4);
          *(undefined4 *)(a + uStack_40 * 4) = *(undefined4 *)(b + uStack_40 * 4);
          *(undefined4 *)(b + uStack_40 * 4) = uVar3;
        }
      }
    }
    else {
      i = size & 7;
      for (c = (CC_QSORT_SWAP8)0x0; (ulong)c < size >> 3; c.chr = c.chr + 1) {
        uVar4 = *(undefined8 *)(a + (long)c * 8);
        *(undefined8 *)(a + (long)c * 8) = *(undefined8 *)(b + (long)c * 8);
        *(undefined8 *)(b + (long)c * 8) = uVar4;
      }
    }
    for (uStack_60 = 0; uStack_60 < i; uStack_60 = uStack_60 + 1) {
      cVar1 = a[uStack_60];
      a[uStack_60] = b[uStack_60];
      b[uStack_60] = cVar1;
    }
  }
  return;
}

Assistant:

static inline void swap(T* a, T* b, size_t size)
        {
            if (a == b) return;

            size_t mod;
            if (size >= 8)
            {
                mod = size & 7;
                CC_QSORT_SWAP_LOOP(CC_QSORT_SWAP8, (CC_QSORT_SWAP8*) a, (CC_QSORT_SWAP8*) b, size / 8)
            }
            else if (size >= 4)
            {
                mod = size & 3;
                CC_QSORT_SWAP_LOOP(CC_QSORT_SWAP4, (CC_QSORT_SWAP4*) a, (CC_QSORT_SWAP4*) b, size / 4)
            }
            else
            {
                mod = size & 1;
                CC_QSORT_SWAP_LOOP(CC_QSORT_SWAP2, (CC_QSORT_SWAP2*) a, (CC_QSORT_SWAP2*) b, size / 2)
            }

            CC_QSORT_SWAP_LOOP(char, (char*) a, (char*) b, mod);
        }